

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O1

void Wlc_NtkCollectStats(Wlc_Ntk_t *p,int (*nObjs) [60])

{
  ushort uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  
  if ((p->vPos).nSize != 2) {
    return;
  }
  lVar4 = 0;
  do {
    Wlc_NtkMarkCone(p,(int)lVar4,1,1,0);
    if (1 < p->iObj) {
      lVar2 = 1;
      lVar3 = 0x18;
      do {
        if (p->nObjsAlloc <= lVar2) {
          __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlc.h"
                        ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
        }
        uVar1 = *(ushort *)(&p->pObjs->field_0x0 + lVar3);
        if ((char)uVar1 < '\0') {
          nObjs[lVar4][uVar1 & 0x3f] = nObjs[lVar4][uVar1 & 0x3f] + 1;
        }
        lVar2 = lVar2 + 1;
        lVar3 = lVar3 + 0x18;
      } while (lVar2 < p->iObj);
    }
    bVar5 = lVar4 == 0;
    lVar4 = lVar4 + 1;
  } while (bVar5);
  Wlc_NtkCleanMarks(p);
  return;
}

Assistant:

void Wlc_NtkCollectStats( Wlc_Ntk_t * p, int nObjs[2][WLC_OBJ_NUMBER] )
{
    Wlc_Obj_t * pObj;
    int n, i;
    if ( Wlc_NtkPoNum(p) != 2 )
        return;
    for ( n = 0; n < 2; n++ )
    {
        Wlc_NtkMarkCone( p, n, 1, 1, 0 );
        Wlc_NtkForEachObj( p, pObj, i )
            if ( pObj->Mark )
                nObjs[n][pObj->Type]++;
    }
    Wlc_NtkCleanMarks( p );
}